

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-inl.h
# Opt level: O3

void __thiscall
wabt::interp::RefPtr<wabt::interp::Instance>::RefPtr
          (RefPtr<wabt::interp::Instance> *this,Store *store,Ref ref)

{
  Object *pOVar1;
  Instance *pIVar2;
  Store *pSVar3;
  Store *pSVar4;
  pointer pRVar5;
  Index IVar6;
  size_type __n;
  ElemSegment *pEVar7;
  Store *pSVar8;
  undefined8 *in_RCX;
  Store *store_00;
  ElemSegment *pEVar9;
  interp *this_00;
  Ptr *in_R8;
  Ref local_20;
  
  pOVar1 = (store->objects_).list_.
           super__Vector_base<wabt::interp::Object_*,_std::allocator<wabt::interp::Object_*>_>.
           _M_impl.super__Vector_impl_data._M_start[ref.index];
  if (((ulong)pOVar1 & 1) == 0) {
    this_00 = (interp *)(long)(int)pOVar1->kind_;
    if (this_00 != (interp *)0xb) {
      if (ref.index == 0) {
        this_00 = (interp *)0x0;
      }
      interp::RefPtr(this_00);
      __n = std::vector<wabt::interp::ElemSegment,_std::allocator<wabt::interp::ElemSegment>_>::
            _M_check_len((vector<wabt::interp::ElemSegment,_std::allocator<wabt::interp::ElemSegment>_>
                          *)this_00,1,"vector::_M_realloc_insert");
      pSVar3 = *(Store **)this_00;
      pSVar4 = *(Store **)((new_allocator<wabt::interp::ElemSegment> *)this_00 + 8);
      if (__n == 0) {
        pEVar7 = (ElemSegment *)0x0;
      }
      else {
        pEVar7 = __gnu_cxx::new_allocator<wabt::interp::ElemSegment>::allocate
                           ((new_allocator<wabt::interp::ElemSegment> *)this_00,__n,(void *)0x0);
      }
      ElemSegment::ElemSegment
                (pEVar7 + ((long)store - (long)pSVar3 >> 5),store_00,(ElemDesc *)*in_RCX,in_R8);
      pEVar9 = pEVar7;
      for (pSVar8 = pSVar3; pSVar8 != store; pSVar8 = (Store *)&(pSVar8->gc_context_).marks) {
        pRVar5 = *(pointer *)&(pSVar8->features_).tail_call_enabled_;
        pEVar9->desc_ = *(ElemDesc **)&pSVar8->features_;
        (pEVar9->elements_).
        super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
        super__Vector_impl_data._M_start = pRVar5;
        (pEVar9->elements_).
        super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
        super__Vector_impl_data._M_finish = *(pointer *)&(pSVar8->features_).extended_const_enabled_
        ;
        (pEVar9->elements_).
        super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = *(pointer *)&pSVar8->gc_context_;
        (pSVar8->features_).tail_call_enabled_ = false;
        (pSVar8->features_).bulk_memory_enabled_ = false;
        (pSVar8->features_).reference_types_enabled_ = false;
        (pSVar8->features_).annotations_enabled_ = false;
        (pSVar8->features_).code_metadata_enabled_ = false;
        (pSVar8->features_).gc_enabled_ = false;
        (pSVar8->features_).memory64_enabled_ = false;
        (pSVar8->features_).multi_memory_enabled_ = false;
        *(undefined8 *)&(pSVar8->features_).extended_const_enabled_ = 0;
        *(undefined8 *)&pSVar8->gc_context_ = 0;
        pEVar9 = pEVar9 + 1;
      }
      for (; pEVar9 = pEVar9 + 1, pSVar4 != store; store = (Store *)&(store->gc_context_).marks) {
        pRVar5 = *(pointer *)&(store->features_).tail_call_enabled_;
        pEVar9->desc_ = *(ElemDesc **)&store->features_;
        (pEVar9->elements_).
        super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
        super__Vector_impl_data._M_start = pRVar5;
        (pEVar9->elements_).
        super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
        super__Vector_impl_data._M_finish = *(pointer *)&(store->features_).extended_const_enabled_;
        (pEVar9->elements_).
        super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = *(pointer *)&store->gc_context_;
        (store->features_).tail_call_enabled_ = false;
        (store->features_).bulk_memory_enabled_ = false;
        (store->features_).reference_types_enabled_ = false;
        (store->features_).annotations_enabled_ = false;
        (store->features_).code_metadata_enabled_ = false;
        (store->features_).gc_enabled_ = false;
        (store->features_).memory64_enabled_ = false;
        (store->features_).multi_memory_enabled_ = false;
        *(undefined8 *)&(store->features_).extended_const_enabled_ = 0;
        *(undefined8 *)&store->gc_context_ = 0;
      }
      if (pSVar3 != (Store *)0x0) {
        operator_delete(pSVar3,*(long *)((new_allocator<wabt::interp::ElemSegment> *)this_00 + 0x10)
                               - (long)pSVar3);
      }
      *(ElemSegment **)this_00 = pEVar7;
      *(ElemSegment **)((new_allocator<wabt::interp::ElemSegment> *)this_00 + 8) = pEVar9;
      *(ElemSegment **)((new_allocator<wabt::interp::ElemSegment> *)this_00 + 0x10) = pEVar7 + __n;
      return;
    }
    local_20.index = ref.index;
    IVar6 = FreeList<wabt::interp::Ref>::New<wabt::interp::Ref&>(&store->roots_,&local_20);
    this->root_index_ = IVar6;
    pIVar2 = (Instance *)
             (store->objects_).list_.
             super__Vector_base<wabt::interp::Object_*,_std::allocator<wabt::interp::Object_*>_>.
             _M_impl.super__Vector_impl_data._M_start[ref.index];
    if (((ulong)pIVar2 & 1) == 0) {
      this->obj_ = pIVar2;
      this->store_ = store;
      return;
    }
  }
  else if (ref.index == 0) {
    interp::RefPtr((interp *)0x0);
  }
  __assert_fail("IsUsed(index)",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/include/wabt/interp/interp-inl.h"
                ,0xe6,
                "T &wabt::interp::FreeList<wabt::interp::Object *>::Get(Index) [T = wabt::interp::Object *]"
               );
}

Assistant:

RefPtr<T>::RefPtr(Store& store, Ref ref) {
#ifndef NDEBUG
  if (!store.Is<T>(ref)) {
    ObjectKind ref_kind;
    if (ref == Ref::Null) {
      ref_kind = ObjectKind::Null;
    } else {
      ref_kind = store.objects_.Get(ref.index)->kind();
    }
    fprintf(stderr, "Invalid conversion from Ref (%s) to RefPtr<%s>!\n",
            GetName(ref_kind), T::GetTypeName());
    abort();
  }
#endif
  root_index_ = store.NewRoot(ref);
  obj_ = static_cast<T*>(store.objects_.Get(ref.index));
  store_ = &store;
}